

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ArrayPtr<const_unsigned_char> __thiscall capnp::_::ListReader::asRawBytes(ListReader *this)

{
  ArrayPtr<const_unsigned_char> AVar1;
  
  if (this->structPointerCount == 0) {
    AVar1.size_ = (ulong)this->structDataSize * (ulong)this->elementCount + 7 >> 3;
    AVar1.ptr = this->ptr;
    return AVar1;
  }
  asRawBytes();
  return (ArrayPtr<const_unsigned_char>)ZEXT816(0);
}

Assistant:

kj::ArrayPtr<const byte> ListReader::asRawBytes() const {
  KJ_REQUIRE(structPointerCount == ZERO * POINTERS,
             "Expected data only, got pointers.") {
    return kj::ArrayPtr<const byte>();
  }

  return arrayPtr(reinterpret_cast<const byte*>(ptr),
      WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(elementCount) * (structDataSize / ELEMENTS)));
}